

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O0

UVec3 __thiscall vkt::image::getLayerSize(image *this,ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  uint uVar2;
  uint z_;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  UVec3 UVar3;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  
  if (imageType < IMAGE_TYPE_2D) {
LAB_00d593d9:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,1,1);
    uVar1 = extraout_EDX;
  }
  else {
    if (1 < imageType - IMAGE_TYPE_2D) {
      if (imageType == IMAGE_TYPE_3D) {
        uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
        uVar2 = tcu::Vector<unsigned_int,_3>::y(imageSize);
        z_ = tcu::Vector<unsigned_int,_3>::z(imageSize);
        tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,z_);
        uVar1 = extraout_EDX_01;
        goto LAB_00d59466;
      }
      if (1 < imageType - IMAGE_TYPE_CUBE) {
        if (imageType != IMAGE_TYPE_BUFFER) {
          tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,1,1,1);
          uVar1 = extraout_EDX_02;
          goto LAB_00d59466;
        }
        goto LAB_00d593d9;
      }
    }
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    uVar2 = tcu::Vector<unsigned_int,_3>::y(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,1);
    uVar1 = extraout_EDX_00;
  }
LAB_00d59466:
  UVar3.m_data[2] = uVar1;
  UVar3.m_data._0_8_ = this;
  return (UVec3)UVar3.m_data;
}

Assistant:

tcu::UVec3 getLayerSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_BUFFER:
			return tcu::UVec3(imageSize.x(), 1u, 1u);

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 1u);

		case IMAGE_TYPE_3D:
			return tcu::UVec3(imageSize.x(), imageSize.y(), imageSize.z());

		default:
			DE_FATAL("Unknown image type");
			return tcu::UVec3(1u, 1u, 1u);
	}
}